

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

char * bn_to_cstr(bn_t *bignumber)

{
  char *str;
  size_t sVar1;
  long in_FS_OFFSET;
  char *ret;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = cstr_new_str(0x102);
  cstr_fill_bytes(&local_30,'\0',0x102);
  str = local_30;
  sVar1 = cstr_strlen(local_30);
  bignum_to_string(&bignumber->inner,str,(int)sVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

static char*
bn_to_cstr(bn_t* bignumber)
{
  /* tiny-bignum-c has 256 as its longest length for a hexadecimal string */
  size_t max_bn_hex_len = 256;

  /* adding +1 for trailing NUL-byte and another +1 to make the number even */
  char* ret = cstr.new_str(max_bn_hex_len + 2);
  cstr.fill_bytes(&ret, '\0', max_bn_hex_len + 2);
  bignum_to_string(&bignumber->inner, ret, cstr.strlen(ret));
  return ret;
}